

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::SetUrl(ScriptContext *this,BSTR bstrUrl)

{
  code *pcVar1;
  bool bVar2;
  UINT UVar3;
  BOOL BVar4;
  size_t sVar5;
  undefined4 *puVar6;
  UrlRecord *pUVar7;
  char16 *url;
  
  if (this->url == (char16_t *)0x0) {
LAB_007844dc:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x241,"(this->url != nullptr && PAL_wcslen(this->url) == 0)",
                                "this->url != nullptr && wcslen(this->url) == 0");
    if (!bVar2) goto LAB_00784676;
    *puVar6 = 0;
  }
  else {
    sVar5 = PAL_wcslen(this->url);
    if (sVar5 != 0) goto LAB_007844dc;
  }
  UVar3 = SysStringLen(bstrUrl);
  url = (char16 *)&DAT_00000008;
  if (UVar3 + 1 != 0) {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00784676;
      *puVar6 = 0;
    }
    url = (char16 *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    (&(this->generalAllocator).
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                     (ulong)(UVar3 + 1) * 2);
    if (url == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00784676:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
      url = (char16 *)0x0;
    }
  }
  sVar5 = (ulong)UVar3 * 2;
  js_memcpy_s(url,sVar5,bstrUrl,sVar5);
  url[UVar3] = L'\0';
  this->url = url;
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,LeakReportFlag);
  if (bVar2) {
    pUVar7 = Memory::LeakReport::LogUrl(url,(this->super_ScriptContextBase).globalObject);
    this->urlRecord = pUVar7;
  }
  return;
}

Assistant:

void ScriptContext::SetUrl(BSTR bstrUrl)
    {
        // Assumption: this method is never called multiple times
        Assert(this->url != nullptr && wcslen(this->url) == 0);

        charcount_t length = SysStringLen(bstrUrl) + 1; // Add 1 for the NULL.

        char16* urlCopy = AnewArray(this->GeneralAllocator(), char16, length);
        js_memcpy_s(urlCopy, (length - 1) * sizeof(char16), bstrUrl, (length - 1) * sizeof(char16));
        urlCopy[length - 1] = _u('\0');

        this->url = urlCopy;
#ifdef LEAK_REPORT
        if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
        {
            this->urlRecord = LeakReport::LogUrl(urlCopy, this->globalObject);
        }
#endif
    }